

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_643cf::SwiftGetVersionCommand::getShortDescription
          (SwiftGetVersionCommand *this,SmallVectorImpl<char> *result)

{
  raw_svector_ostream rStack_38;
  
  llvm::raw_svector_ostream::raw_svector_ostream(&rStack_38,result);
  llvm::raw_ostream::operator<<((raw_ostream *)&rStack_38,"Checking Swift Compiler Version");
  llvm::raw_ostream::~raw_ostream((raw_ostream *)&rStack_38);
  return;
}

Assistant:

virtual void getShortDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream(result) << "Checking Swift Compiler Version";
  }